

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

QString * waitForValue<QString>
                    (QString *__return_storage_ptr__,QPromise<QString> *promise,QString *initial)

{
  QPromiseBase<QString> local_48;
  QPromiseBase<void> local_38;
  undefined1 local_21;
  QString *local_20;
  QString *initial_local;
  QPromise<QString> *promise_local;
  QString *value;
  
  local_21 = 0;
  local_20 = initial;
  initial_local = (QString *)promise;
  promise_local = (QPromise<QString> *)__return_storage_ptr__;
  QString::QString(__return_storage_ptr__,initial);
  QtPromise::QPromiseBase<QString>::
  then<waitForValue<QString>(QtPromise::QPromise<QString>const&,QString_const&)::_lambda(QString_const&)_1_>
            (&local_48,(anon_class_8_1_a8c68091 *)initial_local);
  QtPromise::QPromiseBase<void>::wait(&local_38,&local_48);
  QtPromise::QPromise<void>::~QPromise((QPromise<void> *)&local_38);
  QtPromise::QPromise<void>::~QPromise((QPromise<void> *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

static inline T waitForValue(const QtPromise::QPromise<T>& promise, const T& initial)
{
    T value(initial);
    promise
        .then([&](const T& res) {
            value = res;
        })
        .wait();
    return value;
}